

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~dense_hashtable(dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  if (this->table != (pointer)0x0) {
    destroy_buckets(this,0,this->num_buckets);
    free(this->table);
  }
  KeyInfo::~KeyInfo(&this->key_info);
  return;
}

Assistant:

~dense_hashtable() {
    if (table) {
      destroy_buckets(0, num_buckets);
      val_info.deallocate(table, num_buckets);
    }
  }